

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_LayoutData.H
# Opt level: O1

void __thiscall
amrex::LayoutData<int>::define(LayoutData<int> *this,BoxArray *a_grids,DistributionMapping *a_dm)

{
  FabArrayBase::define(&this->super_FabArrayBase,a_grids,a_dm,1,0);
  this->m_need_to_clear_bd = true;
  FabArrayBase::addThisBD(&this->super_FabArrayBase);
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->m_data).super_vector<int,_std::allocator<int>_>,
             (long)(int)((ulong)((long)(this->super_FabArrayBase).indexArray.
                                       super_vector<int,_std::allocator<int>_>.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(this->super_FabArrayBase).indexArray.
                                      super_vector<int,_std::allocator<int>_>.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2));
  return;
}

Assistant:

void define(const BoxArray           & a_grids,
                const DistributionMapping & a_dm)
      {
        FabArrayBase::define(a_grids, a_dm, 1, 0);
        m_need_to_clear_bd = true;
        addThisBD();
        m_data.resize(local_size());
      }